

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O0

void ans_reorder_fold_decompress<1u>(uint32_t *dst,size_t to_decode,uint8_t *cSrc,size_t cSrcSize)

{
  uint32_t uVar1;
  uint64_t uVar2;
  reference pvVar3;
  uint64_t *state;
  uint8_t **in_u8_00;
  ulong uVar4;
  long in_RCX;
  uint8_t *in_RDX;
  ulong in_RSI;
  uint8_t *in_RDI;
  size_t fast_decode;
  uint32_t *out_u32;
  size_t cur_idx;
  array<unsigned_long,_4UL> states;
  ans_reorder_fold_decode<1U> ans_frame;
  uint8_t *in_u8;
  size_type in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff04;
  ans_reorder_fold_decode<1U> *this;
  ulong local_b0;
  ans_reorder_fold_decode<1U> local_78;
  uint8_t *local_28;
  long local_20;
  ulong local_10;
  
  this = &local_78;
  local_28 = in_RDX;
  local_20 = in_RCX;
  local_10 = in_RSI;
  ans_reorder_fold_decode<1U>::load(in_RDI);
  local_28 = local_28 + local_20;
  uVar2 = ans_reorder_fold_decode<1U>::init_state(this,&local_28);
  pvVar3 = std::array<unsigned_long,_4UL>::operator[]
                     ((array<unsigned_long,_4UL> *)
                      CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      in_stack_fffffffffffffef8);
  *pvVar3 = uVar2;
  state = (uint64_t *)ans_reorder_fold_decode<1U>::init_state(&local_78,&local_28);
  pvVar3 = std::array<unsigned_long,_4UL>::operator[]
                     ((array<unsigned_long,_4UL> *)
                      CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      in_stack_fffffffffffffef8);
  *pvVar3 = (value_type_conflict2)state;
  in_u8_00 = (uint8_t **)ans_reorder_fold_decode<1U>::init_state(&local_78,&local_28);
  pvVar3 = std::array<unsigned_long,_4UL>::operator[]
                     ((array<unsigned_long,_4UL> *)
                      CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      in_stack_fffffffffffffef8);
  *pvVar3 = (value_type_conflict2)in_u8_00;
  uVar2 = ans_reorder_fold_decode<1U>::init_state(&local_78,&local_28);
  pvVar3 = std::array<unsigned_long,_4UL>::operator[]
                     ((array<unsigned_long,_4UL> *)
                      CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      in_stack_fffffffffffffef8);
  *pvVar3 = uVar2;
  uVar4 = local_10 - (local_10 & 3);
  for (local_b0 = 0; local_b0 != uVar4; local_b0 = local_b0 + 4) {
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    uVar1 = ans_reorder_fold_decode<1U>::decode_sym(this,state,in_u8_00);
    *(uint32_t *)(in_RDI + local_b0 * 4) = uVar1;
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    uVar1 = ans_reorder_fold_decode<1U>::decode_sym(this,state,in_u8_00);
    *(uint32_t *)(in_RDI + local_b0 * 4 + 4) = uVar1;
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    uVar1 = ans_reorder_fold_decode<1U>::decode_sym(this,state,in_u8_00);
    *(uint32_t *)(in_RDI + local_b0 * 4 + 8) = uVar1;
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    uVar1 = ans_reorder_fold_decode<1U>::decode_sym(this,state,in_u8_00);
    *(uint32_t *)(in_RDI + local_b0 * 4 + 0xc) = uVar1;
  }
  for (; local_b0 != local_10; local_b0 = local_b0 + 1) {
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    in_stack_ffffffffffffff04 = ans_reorder_fold_decode<1U>::decode_sym(this,state,in_u8_00);
    *(uint32_t *)(in_RDI + local_b0 * 4) = in_stack_ffffffffffffff04;
  }
  ans_reorder_fold_decode<1U>::~ans_reorder_fold_decode
            ((ans_reorder_fold_decode<1U> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  return;
}

Assistant:

void ans_reorder_fold_decompress(
    uint32_t* dst, size_t to_decode, const uint8_t* cSrc, size_t cSrcSize)
{
    auto in_u8 = reinterpret_cast<const uint8_t*>(cSrc);
    auto ans_frame = ans_reorder_fold_decode<fidelity>::load(in_u8);
    in_u8 += cSrcSize;

    std::array<uint64_t, 4> states;
    states[3] = ans_frame.init_state(in_u8);
    states[2] = ans_frame.init_state(in_u8);
    states[1] = ans_frame.init_state(in_u8);
    states[0] = ans_frame.init_state(in_u8);

    size_t cur_idx = 0;
    auto out_u32 = reinterpret_cast<uint32_t*>(dst);
    size_t fast_decode = to_decode - (to_decode % 4);
    while (cur_idx != fast_decode) {
        out_u32[cur_idx] = ans_frame.decode_sym(states[3], in_u8);
        out_u32[cur_idx + 1] = ans_frame.decode_sym(states[2], in_u8);
        out_u32[cur_idx + 2] = ans_frame.decode_sym(states[1], in_u8);
        out_u32[cur_idx + 3] = ans_frame.decode_sym(states[0], in_u8);
        cur_idx += 4;
    }
    while (cur_idx != to_decode) {
        out_u32[cur_idx] = ans_frame.decode_sym(states[0], in_u8);
        cur_idx++;
    }
}